

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::NavigationBar::NavigationBar(NavigationBar *this,QWidget *parent)

{
  NavigationBarPrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00193c30;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationBar_00193de0;
  this_00 = (NavigationBarPrivate *)operator_new(0x80);
  this_00->q = this;
  this_00->stack = (QStackedWidget *)0x0;
  (this_00->rootItems).d.d = (Data *)0x0;
  (this_00->rootItems).d.ptr = (QSharedPointer<QtMWidgets::NavigationItem> *)0x0;
  (this_00->rootItems).d.size = 0;
  (this_00->itemsMap).d.d =
       (QMapData<std::map<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>,_std::less<QWidget_*>,_std::allocator<std::pair<QWidget_*const,_QSharedPointer<QtMWidgets::NavigationItem>_>_>_>_>
        *)0x0;
  this_00->left = (NavigationButton *)0x0;
  this_00->right = (NavigationButton *)0x0;
  this_00->title = (TextLabel *)0x0;
  this_00->grid = (QGridLayout *)0x0;
  (this_00->backStack).super_QList<int>.d.d = (Data *)0x0;
  (this_00->backStack).super_QList<int>.d.ptr = (int *)0x0;
  (this_00->backStack).super_QList<int>.d.size = 0;
  (this_00->forwardStack).super_QList<int>.d.d = (Data *)0x0;
  (this_00->forwardStack).super_QList<int>.d.ptr = (int *)0x0;
  (this_00->forwardStack).super_QList<int>.d.size = 0;
  (this->d).d = this_00;
  NavigationBarPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

NavigationBar::NavigationBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new NavigationBarPrivate( this ) )
{
	d->init();
}